

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O1

ssize_t __thiscall vox::DICT::write(DICT *this,int __fd,void *__buf,size_t __n)

{
  pointer pDVar1;
  size_t sVar2;
  FILE *__s;
  void *extraout_RDX;
  void *__buf_00;
  void *__buf_01;
  void *extraout_RDX_00;
  undefined4 in_register_00000034;
  long lVar3;
  long lVar4;
  
  __s = (FILE *)CONCAT44(in_register_00000034,__fd);
  this->count = (int)((ulong)((long)(this->keys).
                                    super__Vector_base<vox::DICTitem,_std::allocator<vox::DICTitem>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->keys).
                                   super__Vector_base<vox::DICTitem,_std::allocator<vox::DICTitem>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333;
  sVar2 = fwrite(this,4,1,__s);
  if (0 < this->count) {
    lVar3 = 0x28;
    lVar4 = 0;
    __buf_00 = extraout_RDX;
    do {
      pDVar1 = (this->keys).super__Vector_base<vox::DICTitem,_std::allocator<vox::DICTitem>_>.
               _M_impl.super__Vector_impl_data._M_start;
      DICTstring::write((DICTstring *)((long)pDVar1 + lVar3 + -0x28),__fd,__buf_00,(size_t)__s);
      DICTstring::write((DICTstring *)((long)&(pDVar1->key).bufferSize + lVar3),__fd,__buf_01,
                        (size_t)__s);
      lVar4 = lVar4 + 1;
      sVar2 = (size_t)this->count;
      lVar3 = lVar3 + 0x50;
      __buf_00 = extraout_RDX_00;
    } while (lVar4 < (long)sVar2);
  }
  return sVar2;
}

Assistant:

void DICT::write(FILE* fp) {
    count = (int32_t)keys.size();
    fwrite(&count, sizeof(int32_t), 1, fp);
    for (int i = 0; i < count; i++)
        keys[i].write(fp);
}